

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O0

String * __thiscall
Jinx::Impl::GuidToString_abi_cxx11_(String *__return_storage_ptr__,Impl *this,Guid *value)

{
  size_t __maxlen;
  Allocator<char> local_89;
  char local_88 [8];
  char buffer [64];
  Guid *value_local;
  
  __maxlen = std::size<char,64ul>((char (*) [64])local_88);
  snprintf(local_88,__maxlen,"%.*X-%.*X-%.*X-%.*X%.*X-%.*X%.*X%.*X%.*X%.*X%.*X",8,
           (ulong)*(uint *)this,4,(uint)*(ushort *)(this + 4),4,(uint)*(ushort *)(this + 6),2,
           (uint)(byte)this[8],2,(uint)(byte)this[9],2,(uint)(byte)this[10],2,(uint)(byte)this[0xb],
           2,(uint)(byte)this[0xc],2,(uint)(byte)this[0xd],2,(uint)(byte)this[0xe],2,
           (uint)(byte)this[0xf]);
  Allocator<char>::Allocator(&local_89);
  std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
  basic_string<Jinx::Allocator<char>>
            ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
             __return_storage_ptr__,local_88,&local_89);
  return __return_storage_ptr__;
}

Assistant:

inline_t String GuidToString(const Guid & value)
	{
		char buffer[64];
		snprintf(
			buffer,
			std::size(buffer),
			"%.*X-%.*X-%.*X-%.*X%.*X-%.*X%.*X%.*X%.*X%.*X%.*X",
			8, value.data1,
			4, value.data2,
			4, value.data3,
			2, value.data4[0],
			2, value.data4[1],
			2, value.data4[2],
			2, value.data4[3],
			2, value.data4[4],
			2, value.data4[5],
			2, value.data4[6],
			2, value.data4[7]
		);
		return String(buffer);
	}